

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_word_matcher.hpp
# Opt level: O2

bool boost::xpressive::detail::word_boundary<mpl_::bool_<true>>::
     eval<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (bool prevword,bool thisword,
               match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *state)

{
  if (((state->flags_).match_not_bow_ != true) ||
     ((state->cur_)._M_current != (state->begin_)._M_current)) {
    if (((state->flags_).match_not_eow_ != true) ||
       ((state->cur_)._M_current != (state->end_)._M_current)) {
      return prevword != thisword;
    }
    state->found_partial_match_ = true;
  }
  return false;
}

Assistant:

static bool eval(bool prevword, bool thisword, match_state<BidiIter> &state)
        {
            if((state.flags_.match_not_bow_ && state.bos()) || (state.flags_.match_not_eow_ && state.eos()))
            {
                return !IsBoundary::value;
            }

            return IsBoundary::value == (prevword != thisword);
        }